

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

void __thiscall ON_Xform::ON_Xform(ON_Xform *this,float (*m) [4])

{
  undefined8 uVar1;
  
  uVar1 = *(undefined8 *)*m;
  this->m_xform[0][0] = (double)(float)uVar1;
  this->m_xform[0][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(*m + 2);
  this->m_xform[0][2] = (double)(float)uVar1;
  this->m_xform[0][3] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)m[1];
  this->m_xform[1][0] = (double)(float)uVar1;
  this->m_xform[1][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m[1] + 2);
  this->m_xform[1][2] = (double)(float)uVar1;
  this->m_xform[1][3] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)m[2];
  this->m_xform[2][0] = (double)(float)uVar1;
  this->m_xform[2][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m[2] + 2);
  this->m_xform[2][2] = (double)(float)uVar1;
  this->m_xform[2][3] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)m[3];
  this->m_xform[3][0] = (double)(float)uVar1;
  this->m_xform[3][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m[3] + 2);
  this->m_xform[3][2] = (double)(float)uVar1;
  this->m_xform[3][3] = (double)(float)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

ON_Xform::ON_Xform( const float m[4][4] )
{
  m_xform[0][0] = (double)m[0][0];
  m_xform[0][1] = (double)m[0][1];
  m_xform[0][2] = (double)m[0][2];
  m_xform[0][3] = (double)m[0][3];

  m_xform[1][0] = (double)m[1][0];
  m_xform[1][1] = (double)m[1][1];
  m_xform[1][2] = (double)m[1][2];
  m_xform[1][3] = (double)m[1][3];

  m_xform[2][0] = (double)m[2][0];
  m_xform[2][1] = (double)m[2][1];
  m_xform[2][2] = (double)m[2][2];
  m_xform[2][3] = (double)m[2][3];

  m_xform[3][0] = (double)m[3][0];
  m_xform[3][1] = (double)m[3][1];
  m_xform[3][2] = (double)m[3][2];
  m_xform[3][3] = (double)m[3][3];
}